

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

bool __thiscall wabt::Decompiler::ConstIntVal(Decompiler *this,Expr *e,uint64_t *dest)

{
  Enum EVar1;
  ConstExpr *pCVar2;
  ulong uVar3;
  
  *dest = 0;
  if ((e != (Expr *)0x0) && (e->type_ == Const)) {
    pCVar2 = cast<wabt::ConstExpr,wabt::Expr>(e);
    EVar1 = (pCVar2->const_).type_.enum_;
    if (EVar1 == I64) {
      uVar3 = *(ulong *)(pCVar2->const_).data_.v;
    }
    else {
      if (EVar1 != I32) {
        return false;
      }
      uVar3 = (ulong)*(uint *)(pCVar2->const_).data_.v;
    }
    *dest = uVar3;
    return true;
  }
  return false;
}

Assistant:

bool ConstIntVal(const Expr* e, uint64_t &dest) {
    dest = 0;
    if (!e || e->type() != ExprType::Const) return false;
    auto& c = cast<ConstExpr>(e)->const_;
    if (c.type() != Type::I32 && c.type() != Type::I64) return false;
    dest = c.type() == Type::I32 ? c.u32() : c.u64();
    return true;
  }